

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

void __thiscall httplib::ClientImpl::~ClientImpl(ClientImpl *this)

{
  pthread_t pVar1;
  _Manager_type p_Var2;
  pointer pcVar3;
  int iVar4;
  pthread_t pVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  
  this->_vptr_ClientImpl = (_func_int **)&PTR__ClientImpl_001854b8;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->socket_mutex_);
  if (iVar4 == 0) {
    iVar4 = (this->socket_).sock;
    if (iVar4 != -1) {
      shutdown(iVar4,2);
    }
    if (this->socket_requests_in_flight_ != 0) {
      pVar1 = (this->socket_requests_are_from_thread_)._M_thread;
      pVar5 = pthread_self();
      if (pVar1 != pVar5) goto LAB_0012e209;
    }
    iVar4 = (this->socket_).sock;
    if (iVar4 != -1) {
      close(iVar4);
      (this->socket_).sock = -1;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->socket_mutex_);
    p_Var2 = (this->logger_).super__Function_base._M_manager;
    if (p_Var2 != (_Manager_type)0x0) {
      (*p_Var2)((_Any_data *)&this->logger_,(_Any_data *)&this->logger_,__destroy_functor);
    }
    pcVar3 = (this->proxy_bearer_token_auth_token_)._M_dataplus._M_p;
    paVar6 = &(this->proxy_bearer_token_auth_token_).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar6) {
      operator_delete(pcVar3,paVar6->_M_allocated_capacity + 1);
    }
    pcVar3 = (this->proxy_basic_auth_password_)._M_dataplus._M_p;
    paVar6 = &(this->proxy_basic_auth_password_).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar6) {
      operator_delete(pcVar3,paVar6->_M_allocated_capacity + 1);
    }
    pcVar3 = (this->proxy_basic_auth_username_)._M_dataplus._M_p;
    paVar6 = &(this->proxy_basic_auth_username_).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar6) {
      operator_delete(pcVar3,paVar6->_M_allocated_capacity + 1);
    }
    pcVar3 = (this->proxy_host_)._M_dataplus._M_p;
    paVar6 = &(this->proxy_host_).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar6) {
      operator_delete(pcVar3,paVar6->_M_allocated_capacity + 1);
    }
    pcVar3 = (this->interface_)._M_dataplus._M_p;
    paVar6 = &(this->interface_).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar6) {
      operator_delete(pcVar3,paVar6->_M_allocated_capacity + 1);
    }
    p_Var2 = (this->socket_options_).super__Function_base._M_manager;
    if (p_Var2 != (_Manager_type)0x0) {
      (*p_Var2)((_Any_data *)&this->socket_options_,(_Any_data *)&this->socket_options_,
                __destroy_functor);
    }
    pcVar3 = (this->bearer_token_auth_token_)._M_dataplus._M_p;
    paVar6 = &(this->bearer_token_auth_token_).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar6) {
      operator_delete(pcVar3,paVar6->_M_allocated_capacity + 1);
    }
    pcVar3 = (this->basic_auth_password_)._M_dataplus._M_p;
    paVar6 = &(this->basic_auth_password_).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar6) {
      operator_delete(pcVar3,paVar6->_M_allocated_capacity + 1);
    }
    pcVar3 = (this->basic_auth_username_)._M_dataplus._M_p;
    paVar6 = &(this->basic_auth_username_).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar6) {
      operator_delete(pcVar3,paVar6->_M_allocated_capacity + 1);
    }
    pcVar3 = (this->client_key_path_)._M_dataplus._M_p;
    paVar6 = &(this->client_key_path_).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar6) {
      operator_delete(pcVar3,paVar6->_M_allocated_capacity + 1);
    }
    pcVar3 = (this->client_cert_path_)._M_dataplus._M_p;
    paVar6 = &(this->client_cert_path_).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar6) {
      operator_delete(pcVar3,paVar6->_M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&(this->default_headers_)._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&(this->addr_map_)._M_t);
    pcVar3 = (this->host_and_port_)._M_dataplus._M_p;
    paVar6 = &(this->host_and_port_).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar6) {
      operator_delete(pcVar3,paVar6->_M_allocated_capacity + 1);
    }
    pcVar3 = (this->host_)._M_dataplus._M_p;
    paVar6 = &(this->host_).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar6) {
      operator_delete(pcVar3,paVar6->_M_allocated_capacity + 1);
      return;
    }
    return;
  }
  std::__throw_system_error(iVar4);
LAB_0012e209:
  __assert_fail("socket_requests_in_flight_ == 0 || socket_requests_are_from_thread_ == std::this_thread::get_id()"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/3rdparty/httplib.h"
                ,0x18c1,"void httplib::ClientImpl::close_socket(Socket &)");
}

Assistant:

inline ClientImpl::~ClientImpl() {
  std::lock_guard<std::mutex> guard(socket_mutex_);
  shutdown_socket(socket_);
  close_socket(socket_);
}